

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall
wasm::Wasm2JSBuilder::processFunction
          (Wasm2JSBuilder *this,Module *m,Function *func,bool standaloneFunction)

{
  char cVar1;
  JsType JVar2;
  uint uVar3;
  size_type sVar4;
  ulong uVar5;
  wasm *pwVar6;
  Ref RVar7;
  Ref RVar8;
  char *pcVar9;
  undefined8 *puVar10;
  Ref extra;
  size_t sVar11;
  int iVar12;
  undefined7 in_register_00000009;
  Type TVar13;
  uint uVar14;
  Ref in_R8;
  Ref value;
  size_t in_R9;
  Index i;
  IString name;
  Name NVar15;
  IString name_00;
  IString name_01;
  IString IVar16;
  undefined1 auVar17 [16];
  IString arg;
  IString op;
  IString name_02;
  Value *pVVar18;
  Ref theVar;
  undefined1 local_1e8 [40];
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  Value *local_80;
  Ref local_78;
  size_t local_70;
  Module *local_68;
  int local_5c;
  size_t local_58;
  Ref local_50;
  Ref ret;
  allocator<char> local_31;
  char *extraout_RDX;
  
  iVar12 = (int)CONCAT71(in_register_00000009,standaloneFunction);
  ret.inst = (Value *)this;
  if (iVar12 != 0) {
    PassRunner::PassRunner((PassRunner *)&stack0xfffffffffffffd28,m);
    std::__cxx11::string::string<std::allocator<char>>(local_120,"flatten",&local_31);
    local_1e8[0x20] = false;
    ::wasm::PassRunner::add(&stack0xfffffffffffffd28,local_120);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1e8);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::string<std::allocator<char>>
              (local_100,"simplify-locals-notee-nostructure",&local_31);
    local_1c0._M_engaged = false;
    ::wasm::PassRunner::add(&stack0xfffffffffffffd28,local_100);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_1c0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"reorder-locals",&local_31);
    local_198._M_engaged = false;
    ::wasm::PassRunner::add(&stack0xfffffffffffffd28,local_e0);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_198);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"remove-unused-names",&local_31);
    local_170._M_engaged = false;
    ::wasm::PassRunner::add(&stack0xfffffffffffffd28,local_c0);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_170);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"vacuum",&local_31);
    local_148._M_engaged = false;
    ::wasm::PassRunner::add(&stack0xfffffffffffffd28,local_a0);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_148);
    std::__cxx11::string::~string(local_a0);
    ::wasm::PassRunner::runOnFunction((Function *)&stack0xfffffffffffffd28);
    PassRunner::~PassRunner((PassRunner *)&stack0xfffffffffffffd28);
  }
  RVar8.inst = ret.inst;
  local_68 = m;
  std::
  _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)(ret.inst + 0xe));
  std::
  _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)&RVar8.inst[0xb].field_1.str.str._M_str);
  Names::ensureNames(func);
  IVar16 = fromName((Wasm2JSBuilder *)RVar8.inst,
                    (func->super_Importable).super_Named.name.super_IString.str,Top);
  name.str._M_str = IVar16.str._M_str;
  name.str._M_len = (size_t)name.str._M_str;
  local_50 = cashew::ValueBuilder::makeFunction((ValueBuilder *)IVar16.str._M_len,name);
  local_58._0_1_ = true;
  local_5c = iVar12;
  if (*(int *)&RVar8.inst[4].field_0x4 != 0 && !standaloneFunction) {
    sVar4 = std::
            _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&ret.inst[0x25].field_1.str,(key_type *)func);
    local_58._0_1_ = sVar4 != 0;
  }
  TVar13.id = 0;
  while( true ) {
    iVar12 = (int)TVar13.id;
    uVar5 = ::wasm::Function::getNumParams();
    uVar14 = (uint)func;
    if (uVar5 <= TVar13.id) break;
    NVar15.super_IString.str = (IString)::wasm::Function::getLocalNameOrGeneric(uVar14);
    pcVar9 = (char *)0x2;
    IVar16 = fromName((Wasm2JSBuilder *)ret.inst,NVar15,Local);
    arg.str._M_len = IVar16.str._M_str;
    RVar8.inst = (Value *)IVar16.str._M_len;
    arg.str._M_str = pcVar9;
    cashew::ValueBuilder::appendArgumentToFunction((ValueBuilder *)local_50.inst,RVar8,arg);
    if ((char)local_58 != '\0') {
      pwVar6 = (wasm *)::wasm::Function::getLocalType(uVar14);
      JVar2 = ::wasm::wasmToJsType(pwVar6,TVar13);
      cVar1 = needsJsCoercion(JVar2);
      if (cVar1 != '\0') {
        auVar17 = cashew::Ref::operator[]((uint)&local_50);
        name_00.str._M_str = auVar17._8_8_;
        local_80 = (Value *)*auVar17._0_8_;
        name_00.str._M_len = (size_t)arg.str._M_len;
        RVar7 = cashew::ValueBuilder::makeName((ValueBuilder *)RVar8.inst,name_00);
        local_78.inst = cashew::SET;
        local_70 = BLOCK;
        name_01.str._M_str = extraout_RDX;
        name_01.str._M_len = (size_t)arg.str._M_len;
        RVar8 = cashew::ValueBuilder::makeName((ValueBuilder *)RVar8.inst,name_01);
        pcVar9 = (char *)makeJsCoercion(RVar8,JVar2);
        op.str._M_str = pcVar9;
        op.str._M_len = local_70;
        RVar8 = cashew::ValueBuilder::makeBinary(RVar7.inst,local_78,op,in_R8);
        cashew::Value::push_back(local_80,RVar8);
      }
    }
    TVar13.id = (uintptr_t)(iVar12 + 1);
  }
  RVar8 = cashew::ValueBuilder::makeVar(false);
  RVar7 = RVar8;
  puVar10 = (undefined8 *)cashew::Ref::operator[]((uint)&local_50);
  local_58 = cashew::Value::size((Value *)*puVar10);
  puVar10 = (undefined8 *)cashew::Ref::operator[]((uint)&local_50);
  cashew::Value::push_back((Value *)*puVar10,RVar8);
  RVar8.inst = local_50.inst;
  value.inst = (Value *)(ulong)local_5c._0_1_;
  extra = processExpression(ret.inst,func->body,local_68,func,local_5c._0_1_);
  flattenAppend(RVar8,extra);
  uVar3 = ::wasm::Function::getVarIndexBase();
  while( true ) {
    iVar12 = (int)func;
    TVar13.id = (uintptr_t)uVar3;
    uVar5 = ::wasm::Function::getNumLocals();
    if (uVar5 <= TVar13.id) break;
    pVVar18 = RVar7.inst;
    NVar15.super_IString.str = (IString)::wasm::Function::getLocalNameOrGeneric(uVar14);
    IVar16 = fromName((Wasm2JSBuilder *)ret.inst,NVar15,Local);
    name_02.str._M_len = IVar16.str._M_str;
    pwVar6 = (wasm *)::wasm::Function::getLocalType(uVar14);
    JVar2 = ::wasm::wasmToJsType(pwVar6,TVar13);
    func = (Function *)makeJsCoercedZero(JVar2);
    name_02.str._M_str = (char *)func;
    cashew::ValueBuilder::appendToVar
              ((ValueBuilder *)RVar7.inst,(Value *)IVar16.str._M_len,name_02,value);
    uVar3 = uVar3 + 1;
    RVar7.inst = pVVar18;
  }
  puVar10 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xfffffffffffffd28);
  uVar14 = (uint)RVar7.inst;
  sVar11 = cashew::Value::size((Value *)*puVar10);
  if (sVar11 == 0) {
    puVar10 = (undefined8 *)cashew::Ref::operator[]((uint)&local_50);
    cashew::Value::splice
              ((Value *)*puVar10,(int)local_58,(__off64_t *)0x1,iVar12,(__off64_t *)value.inst,in_R9
               ,uVar14);
  }
  return (Ref)local_50.inst;
}

Assistant:

Ref Wasm2JSBuilder::processFunction(Module* m,
                                    Function* func,
                                    bool standaloneFunction) {
  if (standaloneFunction) {
    // We are only printing a function, not a whole module. Prepare it for
    // translation now (if there were a module, we'd have done this for all
    // functions in parallel, earlier).
    PassRunner runner(m);
    // We only run a subset of all passes here. TODO: create a full valid module
    // for each assertion body.
    runner.add("flatten");
    runner.add("simplify-locals-notee-nostructure");
    runner.add("reorder-locals");
    runner.add("remove-unused-names");
    runner.add("vacuum");
    runner.runOnFunction(func);
  }

  // We process multiple functions from a single Wasm2JSBuilder instance, so
  // clean up the function-specific local state before each function.
  frees.clear();
  temps.clear();

  // We will be symbolically referring to all variables in the function, so make
  // sure that everything has a name and it's unique.
  Names::ensureNames(func);
  Ref ret = ValueBuilder::makeFunction(fromName(func->name, NameScope::Top));
  // arguments
  bool needCoercions = options.optimizeLevel == 0 || standaloneFunction ||
                       functionsCallableFromOutside.count(func->name);
  for (Index i = 0; i < func->getNumParams(); i++) {
    IString name = fromName(func->getLocalNameOrGeneric(i), NameScope::Local);
    ValueBuilder::appendArgumentToFunction(ret, name);
    if (needCoercions) {
      auto jsType = wasmToJsType(func->getLocalType(i));
      if (needsJsCoercion(jsType)) {
        ret[3]->push_back(ValueBuilder::makeStatement(ValueBuilder::makeBinary(
          ValueBuilder::makeName(name),
          SET,
          makeJsCoercion(ValueBuilder::makeName(name), jsType))));
      }
    }
  }
  Ref theVar = ValueBuilder::makeVar();
  size_t theVarIndex = ret[3]->size();
  ret[3]->push_back(theVar);
  // body
  flattenAppend(ret,
                processExpression(func->body, m, func, standaloneFunction));
  // vars, including new temp vars
  for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
    ValueBuilder::appendToVar(
      theVar,
      fromName(func->getLocalNameOrGeneric(i), NameScope::Local),
      makeJsCoercedZero(wasmToJsType(func->getLocalType(i))));
  }
  if (theVar[1]->size() == 0) {
    ret[3]->splice(theVarIndex, 1);
  }
  return ret;
}